

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_asn1.cc
# Opt level: O0

int bssl::SSL_SESSION_to_bytes_full(SSL_SESSION *in,CBB *cbb,int for_ticket)

{
  bool bVar1;
  int iVar2;
  uchar *puVar3;
  size_t sVar4;
  pointer psVar5;
  CRYPTO_BUFFER *pCVar6;
  uint8_t *puVar7;
  pointer __s;
  size_t data_len;
  pointer pcVar8;
  size_t local_e0;
  CRYPTO_BUFFER *buffer_1;
  size_t i;
  CRYPTO_BUFFER *buffer;
  CBB child2;
  CBB child;
  CBB session;
  int for_ticket_local;
  CBB *cbb_local;
  SSL_SESSION *in_local;
  
  if ((in == (SSL_SESSION *)0x0) || (in->cipher == (SSL_CIPHER *)0x0)) {
    return 0;
  }
  iVar2 = CBB_add_asn1(cbb,(CBB *)((long)&child.u + 0x18),0x20000010);
  if ((((iVar2 != 0) && (iVar2 = CBB_add_asn1_uint64((CBB *)((long)&child.u + 0x18),1), iVar2 != 0))
      && (iVar2 = CBB_add_asn1_uint64((CBB *)((long)&child.u + 0x18),(ulong)in->ssl_version),
         iVar2 != 0)) &&
     ((iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18),4),
      iVar2 != 0 &&
      (iVar2 = CBB_add_u16((CBB *)((long)&child2.u + 0x18),(uint16_t)in->cipher->id), iVar2 != 0))))
  {
    puVar3 = InplaceVector<unsigned_char,_32UL>::data(&in->session_id);
    if (for_ticket == 0) {
      local_e0 = InplaceVector<unsigned_char,_32UL>::size(&in->session_id);
    }
    else {
      local_e0 = 0;
    }
    iVar2 = CBB_add_asn1_octet_string((CBB *)((long)&child.u + 0x18),puVar3,local_e0);
    if (iVar2 != 0) {
      puVar3 = InplaceVector<unsigned_char,_64UL>::data(&in->secret);
      sVar4 = InplaceVector<unsigned_char,_64UL>::size(&in->secret);
      iVar2 = CBB_add_asn1_octet_string((CBB *)((long)&child.u + 0x18),puVar3,sVar4);
      if (((iVar2 != 0) &&
          (iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18),
                                0xa0000001), iVar2 != 0)) &&
         ((iVar2 = CBB_add_asn1_uint64((CBB *)((long)&child2.u + 0x18),in->time), iVar2 != 0 &&
          ((iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18),
                                 0xa0000002), iVar2 != 0 &&
           (iVar2 = CBB_add_asn1_uint64((CBB *)((long)&child2.u + 0x18),(ulong)in->timeout),
           iVar2 != 0)))))) {
        psVar5 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get(&in->certs);
        sVar4 = sk_CRYPTO_BUFFER_num(psVar5);
        if ((sVar4 != 0) && (((byte)in->field_0x1b8 >> 1 & 1) == 0)) {
          psVar5 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get(&in->certs)
          ;
          pCVar6 = sk_CRYPTO_BUFFER_value(psVar5,0);
          puVar7 = CRYPTO_BUFFER_data(pCVar6);
          sVar4 = CRYPTO_BUFFER_len(pCVar6);
          iVar2 = CBB_add_asn1_element((CBB *)((long)&child.u + 0x18),0xa0000003,puVar7,sVar4);
          if (iVar2 == 0) {
            return 0;
          }
        }
        iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18),
                             0xa0000004);
        if (iVar2 != 0) {
          puVar3 = InplaceVector<unsigned_char,_32UL>::data(&in->sid_ctx);
          sVar4 = InplaceVector<unsigned_char,_32UL>::size(&in->sid_ctx);
          iVar2 = CBB_add_asn1_octet_string((CBB *)((long)&child2.u + 0x18),puVar3,sVar4);
          if (iVar2 != 0) {
            if ((in->verify_result != 0) &&
               ((iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18)
                                      ,0xa0000005), iVar2 == 0 ||
                (iVar2 = CBB_add_asn1_uint64((CBB *)((long)&child2.u + 0x18),in->verify_result),
                iVar2 == 0)))) {
              return 0;
            }
            bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&in->psk_identity);
            if (bVar1) {
              iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18),
                                   0xa0000008);
              if (iVar2 == 0) {
                return 0;
              }
              puVar7 = (uint8_t *)
                       std::unique_ptr<char,_bssl::internal::Deleter>::get(&in->psk_identity);
              __s = std::unique_ptr<char,_bssl::internal::Deleter>::get(&in->psk_identity);
              data_len = strlen(__s);
              iVar2 = CBB_add_asn1_octet_string((CBB *)((long)&child2.u + 0x18),puVar7,data_len);
              if (iVar2 == 0) {
                return 0;
              }
            }
            if ((in->ticket_lifetime_hint != 0) &&
               ((iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18)
                                      ,0xa0000009), iVar2 == 0 ||
                (iVar2 = CBB_add_asn1_uint64((CBB *)((long)&child2.u + 0x18),
                                             (ulong)in->ticket_lifetime_hint), iVar2 == 0)))) {
              return 0;
            }
            bVar1 = Array<unsigned_char>::empty(&in->ticket);
            if ((!bVar1) && (for_ticket == 0)) {
              iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18),
                                   0xa000000a);
              if (iVar2 == 0) {
                return 0;
              }
              puVar3 = Array<unsigned_char>::data(&in->ticket);
              sVar4 = Array<unsigned_char>::size(&in->ticket);
              iVar2 = CBB_add_asn1_octet_string((CBB *)((long)&child2.u + 0x18),puVar3,sVar4);
              if (iVar2 == 0) {
                return 0;
              }
            }
            if ((((byte)in->field_0x1b8 >> 1 & 1) != 0) &&
               ((iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18)
                                      ,0xa000000d), iVar2 == 0 ||
                (iVar2 = CBB_add_asn1_octet_string
                                   ((CBB *)((long)&child2.u + 0x18),in->peer_sha256,0x20),
                iVar2 == 0)))) {
              return 0;
            }
            bVar1 = InplaceVector<unsigned_char,_64UL>::empty(&in->original_handshake_hash);
            if (!bVar1) {
              iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18),
                                   0xa000000e);
              if (iVar2 == 0) {
                return 0;
              }
              puVar3 = InplaceVector<unsigned_char,_64UL>::data(&in->original_handshake_hash);
              sVar4 = InplaceVector<unsigned_char,_64UL>::size(&in->original_handshake_hash);
              iVar2 = CBB_add_asn1_octet_string((CBB *)((long)&child2.u + 0x18),puVar3,sVar4);
              if (iVar2 == 0) {
                return 0;
              }
            }
            bVar1 = std::operator!=(&in->signed_cert_timestamp_list,(nullptr_t)0x0);
            if (bVar1) {
              iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18),
                                   0xa000000f);
              if (iVar2 == 0) {
                return 0;
              }
              pcVar8 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                 (&in->signed_cert_timestamp_list);
              puVar7 = CRYPTO_BUFFER_data(pcVar8);
              pcVar8 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                 (&in->signed_cert_timestamp_list);
              sVar4 = CRYPTO_BUFFER_len(pcVar8);
              iVar2 = CBB_add_asn1_octet_string((CBB *)((long)&child2.u + 0x18),puVar7,sVar4);
              if (iVar2 == 0) {
                return 0;
              }
            }
            bVar1 = std::operator!=(&in->ocsp_response,(nullptr_t)0x0);
            if (bVar1) {
              iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18),
                                   0xa0000010);
              if (iVar2 == 0) {
                return 0;
              }
              pcVar8 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                 (&in->ocsp_response);
              puVar7 = CRYPTO_BUFFER_data(pcVar8);
              pcVar8 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                                 (&in->ocsp_response);
              sVar4 = CRYPTO_BUFFER_len(pcVar8);
              iVar2 = CBB_add_asn1_octet_string((CBB *)((long)&child2.u + 0x18),puVar7,sVar4);
              if (iVar2 == 0) {
                return 0;
              }
            }
            if (((in->field_0x1b8 & 1) != 0) &&
               ((iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18)
                                      ,0xa0000011), iVar2 == 0 ||
                (iVar2 = CBB_add_asn1_bool((CBB *)((long)&child2.u + 0x18),1), iVar2 == 0)))) {
              return 0;
            }
            if ((in->group_id != 0) &&
               ((iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18)
                                      ,0xa0000012), iVar2 == 0 ||
                (iVar2 = CBB_add_asn1_uint64((CBB *)((long)&child2.u + 0x18),(ulong)in->group_id),
                iVar2 == 0)))) {
              return 0;
            }
            bVar1 = std::operator!=(&in->certs,(nullptr_t)0x0);
            if ((bVar1) && (((byte)in->field_0x1b8 >> 1 & 1) == 0)) {
              psVar5 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get
                                 (&in->certs);
              sVar4 = sk_CRYPTO_BUFFER_num(psVar5);
              if (1 < sVar4) {
                iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18),
                                     0xa0000013);
                if (iVar2 == 0) {
                  return 0;
                }
                buffer_1 = (CRYPTO_BUFFER *)0x1;
                while( true ) {
                  psVar5 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get
                                     (&in->certs);
                  pCVar6 = (CRYPTO_BUFFER *)sk_CRYPTO_BUFFER_num(psVar5);
                  if (pCVar6 <= buffer_1) break;
                  psVar5 = std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::get
                                     (&in->certs);
                  pCVar6 = sk_CRYPTO_BUFFER_value(psVar5,(size_t)buffer_1);
                  puVar7 = CRYPTO_BUFFER_data(pCVar6);
                  sVar4 = CRYPTO_BUFFER_len(pCVar6);
                  iVar2 = CBB_add_bytes((CBB *)((long)&child2.u + 0x18),puVar7,sVar4);
                  if (iVar2 == 0) {
                    return 0;
                  }
                  buffer_1 = (CRYPTO_BUFFER *)((long)&buffer_1->pool + 1);
                }
              }
            }
            if ((((byte)in->field_0x1b8 >> 3 & 1) != 0) &&
               (((iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),
                                       (CBB *)((long)&child2.u + 0x18),0xa0000015), iVar2 == 0 ||
                 (iVar2 = CBB_add_asn1((CBB *)((long)&child2.u + 0x18),(CBB *)&buffer,4), iVar2 == 0
                 )) || (iVar2 = CBB_add_u32((CBB *)&buffer,in->ticket_age_add), iVar2 == 0)))) {
              return 0;
            }
            if ((((byte)in->field_0x1b8 >> 4 & 1) == 0) &&
               ((iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18)
                                      ,0xa0000016), iVar2 == 0 ||
                (iVar2 = CBB_add_asn1_bool((CBB *)((long)&child2.u + 0x18),0), iVar2 == 0)))) {
              return 0;
            }
            if ((in->peer_signature_algorithm != 0) &&
               ((iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18)
                                      ,0xa0000017), iVar2 == 0 ||
                (iVar2 = CBB_add_asn1_uint64((CBB *)((long)&child2.u + 0x18),
                                             (ulong)in->peer_signature_algorithm), iVar2 == 0)))) {
              return 0;
            }
            if ((in->ticket_max_early_data != 0) &&
               ((iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18)
                                      ,0xa0000018), iVar2 == 0 ||
                (iVar2 = CBB_add_asn1_uint64((CBB *)((long)&child2.u + 0x18),
                                             (ulong)in->ticket_max_early_data), iVar2 == 0)))) {
              return 0;
            }
            if ((in->timeout != in->auth_timeout) &&
               ((iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18)
                                      ,0xa0000019), iVar2 == 0 ||
                (iVar2 = CBB_add_asn1_uint64((CBB *)((long)&child2.u + 0x18),(ulong)in->auth_timeout
                                            ), iVar2 == 0)))) {
              return 0;
            }
            bVar1 = Array<unsigned_char>::empty(&in->early_alpn);
            if (!bVar1) {
              iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18),
                                   0xa000001a);
              if (iVar2 == 0) {
                return 0;
              }
              puVar3 = Array<unsigned_char>::data(&in->early_alpn);
              sVar4 = Array<unsigned_char>::size(&in->early_alpn);
              iVar2 = CBB_add_asn1_octet_string((CBB *)((long)&child2.u + 0x18),puVar3,sVar4);
              if (iVar2 == 0) {
                return 0;
              }
            }
            if ((((byte)in->field_0x1b8 >> 5 & 1) != 0) &&
               ((iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18)
                                      ,0xa000001b), iVar2 == 0 ||
                (iVar2 = CBB_add_asn1_bool((CBB *)((long)&child2.u + 0x18),1), iVar2 == 0)))) {
              return 0;
            }
            bVar1 = Array<unsigned_char>::empty(&in->quic_early_data_context);
            if (!bVar1) {
              iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18),
                                   0xa000001c);
              if (iVar2 == 0) {
                return 0;
              }
              puVar3 = Array<unsigned_char>::data(&in->quic_early_data_context);
              sVar4 = Array<unsigned_char>::size(&in->quic_early_data_context);
              iVar2 = CBB_add_asn1_octet_string((CBB *)((long)&child2.u + 0x18),puVar3,sVar4);
              if (iVar2 == 0) {
                return 0;
              }
            }
            if (((byte)in->field_0x1b8 >> 6 & 1) != 0) {
              iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18),
                                   0xa000001d);
              if (iVar2 != 0) {
                puVar3 = Array<unsigned_char>::data(&in->local_application_settings);
                sVar4 = Array<unsigned_char>::size(&in->local_application_settings);
                iVar2 = CBB_add_asn1_octet_string((CBB *)((long)&child2.u + 0x18),puVar3,sVar4);
                if ((iVar2 != 0) &&
                   (iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),
                                         (CBB *)((long)&child2.u + 0x18),0xa000001e), iVar2 != 0)) {
                  puVar3 = Array<unsigned_char>::data(&in->peer_application_settings);
                  sVar4 = Array<unsigned_char>::size(&in->peer_application_settings);
                  iVar2 = CBB_add_asn1_octet_string((CBB *)((long)&child2.u + 0x18),puVar3,sVar4);
                  if (iVar2 != 0) goto LAB_00367bb8;
                }
              }
              return 0;
            }
LAB_00367bb8:
            if (((char)in->field_0x1b8 < '\0') &&
               ((iVar2 = CBB_add_asn1((CBB *)((long)&child.u + 0x18),(CBB *)((long)&child2.u + 0x18)
                                      ,0xa000001f), iVar2 == 0 ||
                (iVar2 = CBB_add_asn1_bool((CBB *)((long)&child2.u + 0x18),1), iVar2 == 0)))) {
              return 0;
            }
            iVar2 = CBB_flush(cbb);
            return iVar2;
          }
        }
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

static int SSL_SESSION_to_bytes_full(const SSL_SESSION *in, CBB *cbb,
                                     int for_ticket) {
  if (in == NULL || in->cipher == NULL) {
    return 0;
  }

  CBB session, child, child2;
  if (!CBB_add_asn1(cbb, &session, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&session, kVersion) ||
      !CBB_add_asn1_uint64(&session, in->ssl_version) ||
      !CBB_add_asn1(&session, &child, CBS_ASN1_OCTETSTRING) ||
      !CBB_add_u16(&child, (uint16_t)(in->cipher->id & 0xffff)) ||
      // The session ID is irrelevant for a session ticket.
      !CBB_add_asn1_octet_string(&session, in->session_id.data(),
                                 for_ticket ? 0 : in->session_id.size()) ||
      !CBB_add_asn1_octet_string(&session, in->secret.data(),
                                 in->secret.size()) ||
      !CBB_add_asn1(&session, &child, kTimeTag) ||
      !CBB_add_asn1_uint64(&child, in->time) ||
      !CBB_add_asn1(&session, &child, kTimeoutTag) ||
      !CBB_add_asn1_uint64(&child, in->timeout)) {
    return 0;
  }

  // The peer certificate is only serialized if the SHA-256 isn't
  // serialized instead.
  if (sk_CRYPTO_BUFFER_num(in->certs.get()) > 0 && !in->peer_sha256_valid) {
    const CRYPTO_BUFFER *buffer = sk_CRYPTO_BUFFER_value(in->certs.get(), 0);
    if (!CBB_add_asn1_element(&session, kPeerTag, CRYPTO_BUFFER_data(buffer),
                              CRYPTO_BUFFER_len(buffer))) {
      return 0;
    }
  }

  // Although it is OPTIONAL and usually empty, OpenSSL has
  // historically always encoded the sid_ctx.
  if (!CBB_add_asn1(&session, &child, kSessionIDContextTag) ||
      !CBB_add_asn1_octet_string(&child, in->sid_ctx.data(),
                                 in->sid_ctx.size())) {
    return 0;
  }

  if (in->verify_result != X509_V_OK) {
    if (!CBB_add_asn1(&session, &child, kVerifyResultTag) ||
        !CBB_add_asn1_uint64(&child, in->verify_result)) {
      return 0;
    }
  }

  if (in->psk_identity) {
    if (!CBB_add_asn1(&session, &child, kPSKIdentityTag) ||
        !CBB_add_asn1_octet_string(&child,
                                   (const uint8_t *)in->psk_identity.get(),
                                   strlen(in->psk_identity.get()))) {
      return 0;
    }
  }

  if (in->ticket_lifetime_hint > 0) {
    if (!CBB_add_asn1(&session, &child, kTicketLifetimeHintTag) ||
        !CBB_add_asn1_uint64(&child, in->ticket_lifetime_hint)) {
      return 0;
    }
  }

  if (!in->ticket.empty() && !for_ticket) {
    if (!CBB_add_asn1(&session, &child, kTicketTag) ||
        !CBB_add_asn1_octet_string(&child, in->ticket.data(),
                                   in->ticket.size())) {
      return 0;
    }
  }

  if (in->peer_sha256_valid) {
    if (!CBB_add_asn1(&session, &child, kPeerSHA256Tag) ||
        !CBB_add_asn1_octet_string(&child, in->peer_sha256,
                                   sizeof(in->peer_sha256))) {
      return 0;
    }
  }

  if (!in->original_handshake_hash.empty()) {
    if (!CBB_add_asn1(&session, &child, kOriginalHandshakeHashTag) ||
        !CBB_add_asn1_octet_string(&child, in->original_handshake_hash.data(),
                                   in->original_handshake_hash.size())) {
      return 0;
    }
  }

  if (in->signed_cert_timestamp_list != nullptr) {
    if (!CBB_add_asn1(&session, &child, kSignedCertTimestampListTag) ||
        !CBB_add_asn1_octet_string(
            &child, CRYPTO_BUFFER_data(in->signed_cert_timestamp_list.get()),
            CRYPTO_BUFFER_len(in->signed_cert_timestamp_list.get()))) {
      return 0;
    }
  }

  if (in->ocsp_response != nullptr) {
    if (!CBB_add_asn1(&session, &child, kOCSPResponseTag) ||
        !CBB_add_asn1_octet_string(
            &child, CRYPTO_BUFFER_data(in->ocsp_response.get()),
            CRYPTO_BUFFER_len(in->ocsp_response.get()))) {
      return 0;
    }
  }

  if (in->extended_master_secret) {
    if (!CBB_add_asn1(&session, &child, kExtendedMasterSecretTag) ||
        !CBB_add_asn1_bool(&child, true)) {
      return 0;
    }
  }

  if (in->group_id > 0 &&                               //
      (!CBB_add_asn1(&session, &child, kGroupIDTag) ||  //
       !CBB_add_asn1_uint64(&child, in->group_id))) {
    return 0;
  }

  // The certificate chain is only serialized if the leaf's SHA-256 isn't
  // serialized instead.
  if (in->certs != NULL &&       //
      !in->peer_sha256_valid &&  //
      sk_CRYPTO_BUFFER_num(in->certs.get()) >= 2) {
    if (!CBB_add_asn1(&session, &child, kCertChainTag)) {
      return 0;
    }
    for (size_t i = 1; i < sk_CRYPTO_BUFFER_num(in->certs.get()); i++) {
      const CRYPTO_BUFFER *buffer = sk_CRYPTO_BUFFER_value(in->certs.get(), i);
      if (!CBB_add_bytes(&child, CRYPTO_BUFFER_data(buffer),
                         CRYPTO_BUFFER_len(buffer))) {
        return 0;
      }
    }
  }

  if (in->ticket_age_add_valid) {
    if (!CBB_add_asn1(&session, &child, kTicketAgeAddTag) ||
        !CBB_add_asn1(&child, &child2, CBS_ASN1_OCTETSTRING) ||
        !CBB_add_u32(&child2, in->ticket_age_add)) {
      return 0;
    }
  }

  if (!in->is_server) {
    if (!CBB_add_asn1(&session, &child, kIsServerTag) ||
        !CBB_add_asn1_bool(&child, false)) {
      return 0;
    }
  }

  if (in->peer_signature_algorithm != 0 &&
      (!CBB_add_asn1(&session, &child, kPeerSignatureAlgorithmTag) ||
       !CBB_add_asn1_uint64(&child, in->peer_signature_algorithm))) {
    return 0;
  }

  if (in->ticket_max_early_data != 0 &&
      (!CBB_add_asn1(&session, &child, kTicketMaxEarlyDataTag) ||
       !CBB_add_asn1_uint64(&child, in->ticket_max_early_data))) {
    return 0;
  }

  if (in->timeout != in->auth_timeout &&
      (!CBB_add_asn1(&session, &child, kAuthTimeoutTag) ||
       !CBB_add_asn1_uint64(&child, in->auth_timeout))) {
    return 0;
  }

  if (!in->early_alpn.empty()) {
    if (!CBB_add_asn1(&session, &child, kEarlyALPNTag) ||
        !CBB_add_asn1_octet_string(&child, in->early_alpn.data(),
                                   in->early_alpn.size())) {
      return 0;
    }
  }

  if (in->is_quic) {
    if (!CBB_add_asn1(&session, &child, kIsQuicTag) ||
        !CBB_add_asn1_bool(&child, true)) {
      return 0;
    }
  }

  if (!in->quic_early_data_context.empty()) {
    if (!CBB_add_asn1(&session, &child, kQuicEarlyDataContextTag) ||
        !CBB_add_asn1_octet_string(&child, in->quic_early_data_context.data(),
                                   in->quic_early_data_context.size())) {
      return 0;
    }
  }

  if (in->has_application_settings) {
    if (!CBB_add_asn1(&session, &child, kLocalALPSTag) ||
        !CBB_add_asn1_octet_string(&child,
                                   in->local_application_settings.data(),
                                   in->local_application_settings.size()) ||
        !CBB_add_asn1(&session, &child, kPeerALPSTag) ||
        !CBB_add_asn1_octet_string(&child, in->peer_application_settings.data(),
                                   in->peer_application_settings.size())) {
      return 0;
    }
  }

  if (in->is_resumable_across_names) {
    if (!CBB_add_asn1(&session, &child, kResumableAcrossNamesTag) ||
        !CBB_add_asn1_bool(&child, true)) {
      return 0;
    }
  }

  return CBB_flush(cbb);
}